

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O0

int pack(uint16_t *s,uint8_t *b,int flatfields,int exactmax)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int bias;
  int shift;
  uint16_t tMax;
  uint16_t t [16];
  int rMax;
  int rMin;
  int r [15];
  int d [16];
  bool local_f5;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e0;
  ushort local_da;
  ushort local_d8 [20];
  int local_b0;
  int local_ac;
  int local_a8 [16];
  int local_68 [4];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_20;
  int local_1c;
  undefined1 *local_18;
  int local_4;
  
  local_e0 = -1;
  for (local_e8 = 0; local_e8 < 0x10; local_e8 = local_e8 + 1) {
    if ((*(ushort *)(in_RDI + (long)local_e8 * 2) & 0x7c00) == 0x7c00) {
      local_d8[local_e8] = 0x8000;
    }
    else if ((*(ushort *)(in_RDI + (long)local_e8 * 2) & 0x8000) == 0) {
      local_d8[local_e8] = *(ushort *)(in_RDI + (long)local_e8 * 2) | 0x8000;
    }
    else {
      local_d8[local_e8] = *(ushort *)(in_RDI + (long)local_e8 * 2) ^ 0xffff;
    }
  }
  local_da = 0;
  for (local_ec = 0; local_20 = in_ECX, local_1c = in_EDX, local_18 = in_RSI, local_ec < 0x10;
      local_ec = local_ec + 1) {
    if (local_da < local_d8[local_ec]) {
      local_da = local_d8[local_ec];
    }
  }
  do {
    local_e0 = local_e0 + 1;
    for (local_f0 = 0; local_f0 < 0x10; local_f0 = local_f0 + 1) {
      iVar1 = shiftAndRound((uint)local_da - (uint)local_d8[local_f0],local_e0);
      local_68[local_f0] = iVar1;
    }
    local_a8[0] = (local_68[0] - local_58) + 0x20;
    local_a8[1] = (local_58 - local_48) + 0x20;
    local_a8[2] = (local_48 - local_38) + 0x20;
    local_a8[3] = (local_68[0] - local_68[1]) + 0x20;
    local_a8[4] = (local_58 - local_54) + 0x20;
    local_a8[5] = (local_48 - local_44) + 0x20;
    local_a8[6] = (local_38 - local_34) + 0x20;
    local_a8[7] = (local_68[1] - local_68[2]) + 0x20;
    local_a8[8] = (local_54 - local_50) + 0x20;
    local_a8[9] = (local_44 - local_40) + 0x20;
    local_a8[10] = (local_34 - local_30) + 0x20;
    local_a8[0xb] = (local_68[2] - local_68[3]) + 0x20;
    local_a8[0xc] = (local_50 - local_4c) + 0x20;
    local_a8[0xd] = (local_40 - local_3c) + 0x20;
    local_a8[0xe] = (local_30 - local_2c) + 0x20;
    local_ac = local_a8[0];
    local_b0 = local_a8[0];
    for (local_f4 = 1; local_f4 < 0xf; local_f4 = local_f4 + 1) {
      if (local_a8[local_f4] < local_ac) {
        local_ac = local_a8[local_f4];
      }
      if (local_b0 < local_a8[local_f4]) {
        local_b0 = local_a8[local_f4];
      }
    }
    local_f5 = local_ac < 0 || 0x3f < local_b0;
  } while (local_f5);
  if (((local_ac == 0x20) && (local_b0 == 0x20)) && (local_1c != 0)) {
    *local_18 = (char)(local_d8[0] >> 8);
    local_18[1] = (char)local_d8[0];
    local_18[2] = 0xfc;
    local_4 = 3;
  }
  else {
    if (local_20 != 0) {
      local_d8[0] = local_da - (short)(local_68[0] << ((byte)local_e0 & 0x1f));
    }
    *local_18 = (char)(local_d8[0] >> 8);
    local_18[1] = (char)local_d8[0];
    local_18[2] = (byte)local_e0 * '\x04' | (byte)(local_a8[0] >> 4);
    local_18[3] = (char)local_a8[0] * '\x10' | (byte)(local_a8[1] >> 2);
    local_18[4] = (char)local_a8[1] * '@' | (byte)local_a8[2];
    local_18[5] = (char)local_a8[3] * '\x04' | (byte)(local_a8[4] >> 4);
    local_18[6] = (char)local_a8[4] * '\x10' | (byte)(local_a8[5] >> 2);
    local_18[7] = (char)local_a8[5] * '@' | (byte)local_a8[6];
    local_18[8] = (char)local_a8[7] * '\x04' | (byte)(local_a8[8] >> 4);
    local_18[9] = (char)local_a8[8] * '\x10' | (byte)(local_a8[9] >> 2);
    local_18[10] = (char)local_a8[9] * '@' | (byte)local_a8[10];
    local_18[0xb] = (char)local_a8[0xb] * '\x04' | (byte)(local_a8[0xc] >> 4);
    local_18[0xc] = (char)local_a8[0xc] * '\x10' | (byte)(local_a8[0xd] >> 2);
    local_18[0xd] = (char)local_a8[0xd] * '@' | (byte)local_a8[0xe];
    local_4 = 0xe;
  }
  return local_4;
}

Assistant:

static int
pack (const uint16_t s[16], uint8_t b[14], int flatfields, int exactmax)
{
    int      d[16];
    int      r[15];
    int      rMin;
    int      rMax;
    uint16_t t[16];
    uint16_t tMax;
    int      shift = -1;

    const int bias = 0x20;

    for (int i = 0; i < 16; ++i)
    {
        if ((s[i] & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (s[i] & 0x8000)
            t[i] = ~s[i];
        else
            t[i] = s[i] | 0x8000;
    }

    // find max
    tMax = 0;
    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    //
    // Compute a set of running differences, r[0] ... r[14]:
    // Find a shift value such that after rounding off the
    // rightmost bits and shifting all differences are between
    // -32 and +31.  Then bias the differences so that they
    // end up between 0 and 63.
    //

    do
    {
        shift += 1;

        //
        // Compute absolute differences, d[0] ... d[15],
        // between tMax and t[0] ... t[15].
        //
        // Shift and round the absolute differences.
        //

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        //
        // Convert d[0] .. d[15] into running differences
        //

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    if (rMin == bias && rMax == bias && flatfields)
    {
        //
        // Special case - all pixels have the same value.
        // We encode this in 3 instead of 14 bytes by
        // storing the value 0xfc in the third output byte,
        // which cannot occur in the 14-byte encoding.
        //

        b[0] = (uint8_t) (t[0] >> 8);
        b[1] = (uint8_t) t[0];
        b[2] = 0xfc;

        return 3;
    }

    if (exactmax)
    {
        //
        // Adjust t[0] so that the pixel whose value is equal
        // to tMax gets represented as accurately as possible.
        //

        t[0] = tMax - (uint16_t) (d[0] << shift);
    }

    //
    // Pack t[0], shift and r[0] ... r[14] into 14 bytes:
    //

    b[0]  = (uint8_t) (t[0] >> 8);
    b[1]  = (uint8_t) t[0];
    b[2]  = (uint8_t) ((shift << 2) | (r[0] >> 4));
    b[3]  = (uint8_t) ((r[0] << 4) | (r[1] >> 2));
    b[4]  = (uint8_t) ((r[1] << 6) | r[2]);
    b[5]  = (uint8_t) ((r[3] << 2) | (r[4] >> 4));
    b[6]  = (uint8_t) ((r[4] << 4) | (r[5] >> 2));
    b[7]  = (uint8_t) ((r[5] << 6) | r[6]);
    b[8]  = (uint8_t) ((r[7] << 2) | (r[8] >> 4));
    b[9]  = (uint8_t) ((r[8] << 4) | (r[9] >> 2));
    b[10] = (uint8_t) ((r[9] << 6) | r[10]);
    b[11] = (uint8_t) ((r[11] << 2) | (r[12] >> 4));
    b[12] = (uint8_t) ((r[12] << 4) | (r[13] >> 2));
    b[13] = (uint8_t) ((r[13] << 6) | r[14]);

    return 14;
}